

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<double>(XmlWriter *this,string *name,double *attribute)

{
  ulong uVar1;
  ostream *poVar2;
  ostream *poVar3;
  double *attribute_local;
  string *name_local;
  XmlWriter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = stream(this);
    poVar3 = std::operator<<((ostream *)poVar2," ");
    poVar3 = std::operator<<(poVar3,(string *)name);
    poVar3 = std::operator<<(poVar3,"=\"");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*attribute);
    std::operator<<(poVar3,"\"");
  }
  return this;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            if( !name.empty() )
                stream() << " " << name << "=\"" << attribute << "\"";
            return *this;
        }